

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_commit.cxx
# Opt level: O1

void __thiscall
level_mesh::create_mappings
          (level_mesh *this,lw_face_vec *faces,lw_vmref_vec *vmrefs,xr_vmap_vec *vmaps,
          xr_remapper *face_remap,xr_remapper *vert_remap)

{
  pointer *pp_Var1;
  pointer puVar2;
  pointer pbVar3;
  iterator iVar4;
  pointer p_Var5;
  lw_vmref_entry lVar6;
  lw_vmref_entry lVar7;
  long lVar8;
  uint uVar9;
  uint32_t uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  lw_vmref_entry this_00;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  uint32_t face_idx;
  uint uVar18;
  bool bVar19;
  lw_vmref vmref;
  lw_vmref vmref0;
  uint32_t local_f0;
  lw_vmref_entry local_c8;
  _svector<xray_re::lw_vmref_entry,_5U> local_b8;
  xr_remapper *local_88;
  uint *local_80;
  uint *local_78;
  lw_vmref_entry local_70;
  lw_face_vec *local_68;
  _svector<xray_re::lw_vmref_entry,_5U> local_5c;
  
  uVar12 = (ulong)vert_remap->m_min;
  puVar2 = (this->super_xr_mesh_builder).m_vertex_faces.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 + uVar12 != puVar2 + (ulong)vert_remap->m_max + 1) {
    local_78 = puVar2 + vert_remap->m_max;
    this_00.vmap = 0;
    this_00.offset = 0;
    local_c8.vmap = 0;
    local_c8.offset = 0;
    local_80 = puVar2 + uVar12;
    local_88 = vert_remap;
    local_68 = faces;
    do {
      uVar18 = (uint)uVar12;
      if (*local_80 != 0xffffffff) {
        local_f0 = 0xffffffff;
        if ((local_88->m_min <= uVar18) && (uVar18 <= local_88->m_max)) {
          local_f0 = local_88->m_mapping[uVar18 - local_88->m_min];
        }
        if (local_f0 != 0xffffffff) {
          local_5c.count = 0;
          uVar12 = (ulong)*local_80;
          if (*local_80 != 0xffffffff) {
            uVar16 = 0xffffffff;
            iVar15 = 0;
            do {
              uVar9 = (uint)uVar12;
              uVar14 = uVar12 & 0xffffffff;
              face_idx = 0xffffffff;
              if ((face_remap->m_min <= uVar9) && (uVar9 <= face_remap->m_max)) {
                face_idx = face_remap->m_mapping[uVar9 - face_remap->m_min];
              }
              pbVar3 = (this->super_xr_mesh_builder).m_faces.
                       super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              if (face_idx == 0xffffffff) {
                uVar12 = 0;
                do {
                  uVar13 = uVar12;
                  uVar12 = uVar13;
                  if (uVar13 == 0xfffffffffffffffd) goto LAB_0012c846;
                  uVar12 = uVar13 - 1;
                } while (*(uint *)((long)&pbVar3[uVar14].field_0 + uVar13 * 4 + 8) != uVar18);
                uVar12 = (ulong)*(uint *)((long)&pbVar3[uVar14].field_0 + uVar13 * 4 + 0x2c);
LAB_0012c846:
                if (uVar13 == 0xfffffffffffffffd) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_mesh_builder.h"
                                ,0xa4,
                                "uint32_t xray_re::xr_mesh_builder::b_face::next_face_idx(uint_fast32_t) const"
                               );
                }
              }
              else {
                lVar8 = 3;
                do {
                  lVar17 = lVar8;
                  if (lVar17 == 0) break;
                  lVar8 = lVar17 + -1;
                } while (*(uint *)((long)pbVar3 + (lVar17 + -1) * 4 + uVar14 * 0x40) != uVar18);
                if (lVar17 == 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_mesh_builder.h"
                                ,0x9a,
                                "uint_fast32_t xray_re::xr_mesh_builder::b_face::local_vert_idx(uint_fast32_t) const"
                               );
                }
                uVar9 = *(uint *)((long)&pbVar3[uVar14].field_0 + lVar17 * 4 + 0x14);
                uVar12 = (ulong)uVar9;
                if (uVar12 == 0xffffffff) {
                  __assert_fail("tc != BAD_IDX",
                                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/utils/converter/level_mesh_commit.cxx"
                                ,0x3a,
                                "void level_mesh::create_mappings(lw_face_vec &, lw_vmref_vec &, xr_vmap_vec &, const xr_remapper &, const xr_remapper &) const"
                               );
                }
                if (uVar16 == 0xffffffff) {
                  if (this_00 == (lw_vmref_entry)0x0) {
                    this_00 = (lw_vmref_entry)operator_new(0x58);
                    xray_re::xr_uv_vmap::xr_uv_vmap((xr_uv_vmap *)this_00,"Texture");
                    local_b8.array[0] = this_00;
                    std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>::
                    emplace_back<xray_re::xr_vmap*>
                              ((vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>> *)vmaps,
                               (xr_vmap **)&local_b8);
                  }
                  uVar10 = xray_re::xr_uv_vmap::add_uv
                                     ((xr_uv_vmap *)this_00,
                                      (this->super_xr_mesh_builder).m_texcoords.
                                      super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar12,local_f0);
                  uVar12 = (ulong)local_5c.count;
                  if (4 < uVar12) {
LAB_0012caeb:
                    __assert_fail("count < N",
                                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/./xr_fixed_vector.h"
                                  ,0x5b,
                                  "void xray_re::_svector<xray_re::lw_vmref_entry, 5>::push_back(const T &) [T = xray_re::lw_vmref_entry, N = 5]"
                                 );
                  }
                  local_5c.count = local_5c.count + 1;
                  local_5c.array[uVar12] = (lw_vmref_entry)((ulong)uVar10 << 0x20);
                  iVar4._M_current =
                       (vmrefs->
                       super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
                  iVar15 = (int)((ulong)((long)iVar4._M_current -
                                        (long)(vmrefs->
                                              super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start) >> 2) *
                           -0x45d1745d;
                  uVar16 = uVar9;
                  iVar11 = iVar15;
                  if (iVar4._M_current ==
                      (vmrefs->
                      super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::
                    vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>
                    ::_M_realloc_insert<xray_re::_svector<xray_re::lw_vmref_entry,5u>const&>
                              ((vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>
                                *)vmrefs,iVar4,&local_5c);
                  }
                  else {
                    lVar7.offset = local_5c.array[3].offset;
                    lVar7.vmap = local_5c.array[3].vmap;
                    *(ulong *)&(iVar4._M_current)->array[3].offset =
                         CONCAT44(local_5c.array[4].vmap,local_5c.array[3].offset);
                    *(ulong *)&(iVar4._M_current)->array[4].offset =
                         CONCAT44(local_5c.count,local_5c.array[4].offset);
                    (iVar4._M_current)->array[2] = local_5c.array[2];
                    (iVar4._M_current)->array[3] = lVar7;
                    (iVar4._M_current)->array[0] = local_5c.array[0];
                    (iVar4._M_current)->array[1] = local_5c.array[1];
                    pp_Var1 = &(vmrefs->
                               super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish;
                    *pp_Var1 = *pp_Var1 + 1;
                  }
                }
                else {
                  iVar11 = iVar15;
                  if (uVar16 != uVar9) {
                    local_70 = this_00;
                    if (local_c8 == (lw_vmref_entry)0x0) {
                      local_c8 = (lw_vmref_entry)operator_new(0x70);
                      xray_re::xr_face_uv_vmap::xr_face_uv_vmap
                                ((xr_face_uv_vmap *)local_c8,"Texture");
                      local_b8.array[0] = local_c8;
                      std::vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>>::
                      emplace_back<xray_re::xr_vmap*>
                                ((vector<xray_re::xr_vmap*,std::allocator<xray_re::xr_vmap*>> *)
                                 vmaps,(xr_vmap **)&local_b8);
                    }
                    local_b8.count = 0;
                    uVar10 = xray_re::xr_face_uv_vmap::add_uv
                                       ((xr_face_uv_vmap *)local_c8,
                                        (this->super_xr_mesh_builder).m_texcoords.
                                        super__Vector_base<xray_re::_vector2<float>,_std::allocator<xray_re::_vector2<float>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + uVar12,local_f0,
                                        face_idx);
                    uVar12 = (ulong)local_b8.count;
                    if (4 < uVar12) goto LAB_0012caeb;
                    local_b8.count = local_b8.count + 1;
                    local_b8.array[uVar12] = (lw_vmref_entry)(((ulong)uVar10 << 0x20) + 1);
                    iVar4._M_current =
                         (vmrefs->
                         super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
                    p_Var5 = (vmrefs->
                             super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                             )._M_impl.super__Vector_impl_data._M_start;
                    if (iVar4._M_current ==
                        (vmrefs->
                        super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                        )._M_impl.super__Vector_impl_data._M_end_of_storage) {
                      std::
                      vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>
                      ::_M_realloc_insert<xray_re::_svector<xray_re::lw_vmref_entry,5u>const&>
                                ((vector<xray_re::_svector<xray_re::lw_vmref_entry,5u>,std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,5u>>>
                                  *)vmrefs,iVar4,&local_b8);
                    }
                    else {
                      lVar6.offset = local_b8.array[3].offset;
                      lVar6.vmap = local_b8.array[3].vmap;
                      *(ulong *)&(iVar4._M_current)->array[3].offset =
                           CONCAT44(local_b8.array[4].vmap,local_b8.array[3].offset);
                      *(ulong *)&(iVar4._M_current)->array[4].offset =
                           CONCAT44(local_b8.count,local_b8.array[4].offset);
                      (iVar4._M_current)->array[2] = local_b8.array[2];
                      (iVar4._M_current)->array[3] = lVar6;
                      (iVar4._M_current)->array[0] = local_b8.array[0];
                      (iVar4._M_current)->array[1] = local_b8.array[1];
                      pp_Var1 = &(vmrefs->
                                 super__Vector_base<xray_re::_svector<xray_re::lw_vmref_entry,_5U>,_std::allocator<xray_re::_svector<xray_re::lw_vmref_entry,_5U>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish;
                      *pp_Var1 = *pp_Var1 + 1;
                    }
                    this_00 = local_70;
                    iVar11 = (int)((ulong)((long)iVar4._M_current - (long)p_Var5) >> 2) *
                             -0x45d1745d;
                  }
                }
                *(int *)((long)&(local_68->
                                super__Vector_base<xray_re::lw_face,_std::allocator<xray_re::lw_face>_>
                                )._M_impl.super__Vector_impl_data._M_start[face_idx].field_0 +
                        lVar17 * 4 + 8) = iVar11;
                uVar12 = (ulong)*(uint *)((long)&pbVar3[uVar14].field_0 + lVar17 * 4 + 0x20);
              }
            } while ((int)uVar12 != -1);
          }
        }
      }
      uVar12 = (ulong)(uVar18 + 1);
      bVar19 = local_80 != local_78;
      local_80 = local_80 + 1;
    } while (bVar19);
  }
  return;
}

Assistant:

void level_mesh::create_mappings(lw_face_vec& faces, lw_vmref_vec& vmrefs, xr_vmap_vec& vmaps,
		const xr_remapper& face_remap, const xr_remapper& vert_remap) const
{
	xr_uv_vmap* uv_vmap = 0;
	xr_face_uv_vmap* face_uv_vmap = 0;
	uint32_t vert_idx = vert_remap.min();
	for (std::vector<uint32_t>::const_iterator it = m_vertex_faces.begin() + vert_idx,
			end = m_vertex_faces.begin() + vert_remap.max() + 1; it != end; ++it, ++vert_idx) {
		if (*it == BAD_IDX)
			continue;
		uint32_t mapped_vert_idx = vert_remap[vert_idx];
		if (mapped_vert_idx == BAD_IDX)
			continue;

		lw_vmref vmref0;
		uint32_t tc0 = BAD_IDX, vmref0_idx = 0;
		for (uint32_t face_idx = *it; face_idx != BAD_IDX;) {
			const b_face& face = m_faces[face_idx];
			uint32_t mapped_face_idx = face_remap[face_idx];
			if (mapped_face_idx == BAD_IDX) {
				face_idx = face.next_face_idx(vert_idx);
				continue;
			}
			uint_fast32_t local_idx = face.local_vert_idx(vert_idx);
			uint32_t tc = face.tc[local_idx], vmref_idx;
			xr_assert(tc != BAD_IDX);
			if (tc0 == BAD_IDX) {
				if (uv_vmap == 0) {
					uv_vmap = new xr_uv_vmap("Texture");
					vmaps.push_back(uv_vmap);
				}
				vmref0.push_back(lw_vmref_entry(0, uv_vmap->add_uv(
						m_texcoords[tc0 = tc], mapped_vert_idx)));
				vmref0_idx = vmref_idx = uint32_t(vmrefs.size() & UINT32_MAX);
				vmrefs.push_back(vmref0);
			} else if (tc0 == tc) {
				vmref_idx = vmref0_idx;
			} else {
				if (face_uv_vmap == 0) {
					face_uv_vmap = new xr_face_uv_vmap("Texture");
					vmaps.push_back(face_uv_vmap);
				}
				lw_vmref vmref;
				vmref.push_back(lw_vmref_entry(1, face_uv_vmap->add_uv(
						m_texcoords[tc], mapped_vert_idx, mapped_face_idx)));
				vmref_idx = uint32_t(vmrefs.size() & UINT32_MAX);
				vmrefs.push_back(vmref);
			}
			faces[mapped_face_idx].ref[local_idx] = vmref_idx;
			face_idx = face.link[local_idx];
		}
	}
#if 0
	for (lw_face_vec_it it = faces.begin(); it != faces.end(); ++it) {
		if (it->ref0 == BAD_IDX) {
			msg("face%u, ref0, verts(%u, %u, %u)", it - faces.begin(), it->v0, it->v1, it->v2);
		}
		if (it->ref1 == BAD_IDX) {
			msg("face%u, ref0, verts(%u, %u, %u)", it - faces.begin(), it->v0, it->v1, it->v2);
		}
		if (it->ref2 == BAD_IDX) {
			msg("face%u, ref0, verts(%u, %u, %u)", it - faces.begin(), it->v0, it->v1, it->v2);
		}
		xr_assert(it->ref0 < vmrefs.size());
		xr_assert(it->ref1 < vmrefs.size());
		xr_assert(it->ref2 < vmrefs.size());
	}
#endif
}